

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_global_trace(char *config)

{
  CURLcode CVar1;
  
  curl_simple_lock_lock((atomic_int *)config);
  CVar1 = Curl_trc_opt(config);
  s_lock = 0;
  return CVar1;
}

Assistant:

CURLcode curl_global_trace(const char *config)
{
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  CURLcode result;
  global_init_lock();

  result = Curl_trc_opt(config);

  global_init_unlock();

  return result;
#else
  (void)config;
  return CURLE_OK;
#endif
}